

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O3

void bloaty::dwarf::SkipLEB128(string_view *data)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = data->_M_len;
  uVar2 = 10;
  if (uVar1 < 10) {
    uVar2 = uVar1;
  }
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      if (-1 < data->_M_str[uVar3]) {
        data->_M_str = data->_M_str + uVar3 + 1;
        data->_M_len = ~uVar3 + uVar1;
        return;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  Throw("corrupt DWARF data, unterminated LEB128",0x42);
}

Assistant:

void SkipLEB128(string_view* data) {
  size_t limit =
      std::min(static_cast<size_t>(data->size()), static_cast<size_t>(10));
  for (size_t i = 0; i < limit; i++) {
    if (((*data)[i] & 0x80) == 0) {
      data->remove_prefix(i + 1);
      return;
    }
  }

  THROW("corrupt DWARF data, unterminated LEB128");
}